

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

Symbol * createsymbol(char *symName)

{
  int iVar1;
  uint32_t uVar2;
  Symbol *__s;
  FileStackNode *pFVar3;
  int *piVar4;
  char *pcVar5;
  
  __s = (Symbol *)malloc(0x140);
  if (__s != (Symbol *)0x0) {
    uVar2 = 0;
    iVar1 = snprintf((char *)__s,0x100,"%s",symName);
    if (0xff < iVar1) {
      warning(WARNING_LONG_STR,"Symbol name is too long: \'%s\'\n",symName);
    }
    __s->isExported = false;
    __s->isBuiltin = false;
    __s->hasCallback = false;
    __s->section = (Section *)0x0;
    pFVar3 = fstk_GetFileStack();
    __s->src = pFVar3;
    if (pFVar3 != (FileStackNode *)0x0) {
      uVar2 = lexer_GetLineNo();
    }
    __s->fileLine = uVar2;
    __s->ID = 0xffffffff;
    __s->next = (Symbol *)0x0;
    hash_AddElement(symbols,(char *)__s,__s);
    return __s;
  }
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  fatalerror("Failed to create symbol \'%s\': %s\n",symName,pcVar5);
}

Assistant:

static struct Symbol *createsymbol(char const *symName)
{
	struct Symbol *sym = (struct Symbol *)malloc(sizeof(*sym));

	if (!sym)
		fatalerror("Failed to create symbol '%s': %s\n", symName, strerror(errno));

	if (snprintf(sym->name, MAXSYMLEN + 1, "%s", symName) > MAXSYMLEN)
		warning(WARNING_LONG_STR, "Symbol name is too long: '%s'\n", symName);

	sym->isExported = false;
	sym->isBuiltin = false;
	sym->hasCallback = false;
	sym->section = NULL;
	setSymbolFilename(sym);
	sym->ID = -1;
	sym->next = NULL;

	hash_AddElement(symbols, sym->name, sym);
	return sym;
}